

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O2

Instr * __thiscall LowererMD::Simd128LowerShuffle_4(LowererMD *this,Instr *instr)

{
  OpCode OVar1;
  Instr *pIVar2;
  code *pcVar3;
  uint8 i_1;
  bool bVar4;
  int32 iVar5;
  int32 iVar6;
  int32 iVar7;
  int32 iVar8;
  SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  Opnd *this_01;
  Opnd *pOVar9;
  undefined4 *puVar10;
  IntConstOpnd *pIVar11;
  char *this_02;
  RegOpnd *dst;
  RegOpnd *dst_00;
  RegOpnd *dstOpnd;
  intptr_t pMemLoc;
  MemRefOpnd *src1Opnd;
  Instr *pIVar12;
  uint8 j2;
  byte bVar13;
  uint *lanes_00;
  RegOpnd *pRVar14;
  Opnd *this_03;
  uint8 j1;
  byte bVar15;
  Opnd *this_04;
  Instr *instr_00;
  RegOpnd *src1;
  uint8 i;
  ulong uVar16;
  Opnd *this_05;
  long lVar17;
  RegOpnd *pRStack_a8;
  Opnd *srcs [6];
  uint8 local_64 [4];
  uint local_60;
  uint8 lanesSrc [4];
  uint fromSrc2;
  uint8 ordLanes [4];
  uint8 reArrLanes [4];
  uint fromSrc1;
  undefined4 local_34;
  uint8 lanes [4];
  
  OVar1 = instr->m_opcode;
  this_00 = Simd128GetExtendedArgs(this,instr);
  this_01 = SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Pop(this_00);
  srcs[3] = (Opnd *)0x0;
  srcs[4] = (Opnd *)0x0;
  srcs[1] = (Opnd *)0x0;
  srcs[2] = (Opnd *)0x0;
  pRStack_a8 = (RegOpnd *)0x0;
  srcs[0] = (Opnd *)0x0;
  for (uVar16 = 0;
      ((SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
       (this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>).
       super_SListNodeBase<Memory::ArenaAllocator>.next != this_00 && (uVar16 < 6));
      uVar16 = uVar16 + 1) {
    pOVar9 = SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Pop(this_00);
    srcs[uVar16 - 1] = pOVar9;
  }
  pIVar2 = instr->m_prev;
  IR::Opnd::IsSimd128(this_01);
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar10 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                     ,0x61f,
                     "(dst->IsSimd128() && srcs[0] && srcs[0]->IsSimd128() && srcs[1] && srcs[1]->IsSimd128())"
                     ,
                     "dst->IsSimd128() && srcs[0] && srcs[0]->IsSimd128() && srcs[1] && srcs[1]->IsSimd128()"
                    );
  if (!bVar4) {
LAB_005edf24:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar10 = 0;
  if (((OVar1 != Simd128_Shuffle_I4) && (OVar1 != Simd128_Shuffle_F4)) &&
     (OVar1 != Simd128_Shuffle_U4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x620,
                       "(irOpcode == Js::OpCode::Simd128_Shuffle_I4 || irOpcode == Js::OpCode::Simd128_Shuffle_U4 || irOpcode == Js::OpCode::Simd128_Shuffle_F4)"
                       ,
                       "irOpcode == Js::OpCode::Simd128_Shuffle_I4 || irOpcode == Js::OpCode::Simd128_Shuffle_U4 || irOpcode == Js::OpCode::Simd128_Shuffle_F4"
                      );
    if (!bVar4) goto LAB_005edf24;
    *puVar10 = 0;
  }
  pOVar9 = srcs[1];
  srcs[5] = (Opnd *)instr;
  if (((srcs[1] == (Opnd *)0x0) ||
      (bVar4 = IR::Opnd::IsIntConstOpnd(srcs[1]), this_03 = srcs[2],
      srcs[2] == (Opnd *)0x0 || !bVar4)) ||
     ((bVar4 = IR::Opnd::IsIntConstOpnd(srcs[2]), this_05 = srcs[3],
      srcs[3] == (Opnd *)0x0 || !bVar4 ||
      ((bVar4 = IR::Opnd::IsIntConstOpnd(srcs[3]), this_04 = srcs[4],
       srcs[4] == (Opnd *)0x0 || !bVar4 || (bVar4 = IR::Opnd::IsIntConstOpnd(srcs[4]), !bVar4))))))
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x626,
                       "(srcs[2] && srcs[2]->IsIntConstOpnd() && srcs[3] && srcs[3]->IsIntConstOpnd() && srcs[4] && srcs[4]->IsIntConstOpnd() && srcs[5] && srcs[5]->IsIntConstOpnd())"
                       ,"Type-specialized shuffle is supported only with constant lane indices");
    if (!bVar4) goto LAB_005edf24;
    *puVar10 = 0;
    this_03 = srcs[2];
    this_04 = srcs[4];
    this_05 = srcs[3];
  }
  pIVar11 = IR::Opnd::AsIntConstOpnd(pOVar9);
  iVar5 = IR::IntConstOpnd::AsInt32(pIVar11);
  local_34._0_1_ = (byte)iVar5;
  pIVar11 = IR::Opnd::AsIntConstOpnd(this_03);
  iVar6 = IR::IntConstOpnd::AsInt32(pIVar11);
  local_34._1_1_ = (byte)iVar6;
  pIVar11 = IR::Opnd::AsIntConstOpnd(this_05);
  iVar7 = IR::IntConstOpnd::AsInt32(pIVar11);
  local_34._2_1_ = (byte)iVar7;
  this_02 = (char *)IR::Opnd::AsIntConstOpnd(this_04);
  iVar8 = IR::IntConstOpnd::AsInt32((IntConstOpnd *)this_02);
  bVar13 = (byte)iVar8;
  local_34._3_1_ = bVar13;
  if (7 < (byte)iVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    this_02 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
    ;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x62c,"(lanes[0] >= 0 && lanes[0] < 8)","lanes[0] >= 0 && lanes[0] < 8");
    if (!bVar4) goto LAB_005edf24;
    *puVar10 = 0;
  }
  instr_00 = (Instr *)srcs[5];
  if (7 < (byte)iVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    this_02 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
    ;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x62d,"(lanes[1] >= 0 && lanes[1] < 8)","lanes[1] >= 0 && lanes[1] < 8");
    if (!bVar4) goto LAB_005edf24;
    *puVar10 = 0;
  }
  if (7 < (byte)iVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    this_02 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
    ;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x62e,"(lanes[2] >= 0 && lanes[2] < 8)","lanes[2] >= 0 && lanes[2] < 8");
    if (!bVar4) goto LAB_005edf24;
    *puVar10 = 0;
  }
  if (7 < bVar13) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    this_02 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
    ;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x62f,"(lanes[3] >= 0 && lanes[3] < 8)","lanes[3] >= 0 && lanes[3] < 8");
    if (!bVar4) goto LAB_005edf24;
    *puVar10 = 0;
  }
  CheckShuffleLanes_4((LowererMD *)this_02,(uint8 *)&local_34,local_64,(uint *)ordLanes,&local_60);
  if (local_60 + (int)ordLanes != 4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x632,"(fromSrc1 + fromSrc2 == 4)","fromSrc1 + fromSrc2 == 4");
    if (!bVar4) goto LAB_005edf24;
    *puVar10 = 0;
  }
  if (local_60 == 4 || ordLanes == (uint8  [4])0x4) {
    if (ordLanes != (uint8  [4])0x4) {
      pRStack_a8 = (RegOpnd *)srcs[0];
    }
    lanes_00 = &local_34;
    pRVar14 = pRStack_a8;
  }
  else {
    if (ordLanes != (uint8  [4])0x2) {
      if (local_60 == 3 || ordLanes == (uint8  [4])0x3) {
        dst = IR::RegOpnd::New(this_01->m_type,this->m_func);
        dst_00 = IR::RegOpnd::New(this_01->m_type,this->m_func);
        dstOpnd = IR::RegOpnd::New(this_01->m_type,this->m_func);
        src1 = pRStack_a8;
        pRVar14 = (RegOpnd *)srcs[0];
        if (ordLanes == (uint8  [4])0x3) {
          src1 = (RegOpnd *)srcs[0];
          pRVar14 = pRStack_a8;
        }
        if (srcs[0] == (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                             ,0x66a,"(majSrc != minSrc)","majSrc != minSrc");
          if (!bVar4) goto LAB_005edf24;
          *puVar10 = 0;
        }
        for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
          if (((byte)((src1 != (RegOpnd *)0x0) << 2) <= *(byte *)((long)&local_34 + lVar17)) &&
             (*(byte *)((long)&local_34 + lVar17) < (byte)((src1 != (RegOpnd *)0x0) * '\x04' + 4U)))
          goto LAB_005eddeb;
        }
        lVar17 = 0;
LAB_005eddeb:
        pMemLoc = ThreadContextInfo::GetX86FourLanesMaskAddr
                            (this->m_func->m_threadContextInfo,(uint8)lVar17);
        src1Opnd = IR::MemRefOpnd::New(pMemLoc,this_01->m_type,this->m_func,AddrOpndKindDynamicMisc)
        ;
        InsertShufps(this,(uint8 *)&local_34,&dst->super_Opnd,&pRVar14->super_Opnd,
                     &pRVar14->super_Opnd,instr_00);
        InsertShufps(this,(uint8 *)&local_34,&dst_00->super_Opnd,&src1->super_Opnd,&src1->super_Opnd
                     ,instr_00);
        pIVar12 = IR::Instr::New(MOVUPS,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
        IR::Instr::InsertBefore(instr_00,pIVar12);
        Legalize<false>(pIVar12,false);
        pIVar12 = IR::Instr::New(ANDPS,&dst_00->super_Opnd,&dst_00->super_Opnd,&dstOpnd->super_Opnd,
                                 this->m_func);
        IR::Instr::InsertBefore(instr_00,pIVar12);
        Legalize<false>(pIVar12,false);
        pIVar12 = IR::Instr::New(ANDNPS,&dstOpnd->super_Opnd,&dstOpnd->super_Opnd,&dst->super_Opnd,
                                 this->m_func);
        IR::Instr::InsertBefore(instr_00,pIVar12);
        Legalize<false>(pIVar12,false);
        pIVar12 = IR::Instr::New(ORPS,this_01,&dst_00->super_Opnd,&dstOpnd->super_Opnd,this->m_func)
        ;
        IR::Instr::InsertBefore(instr_00,pIVar12);
        Legalize<false>(pIVar12,false);
      }
      goto LAB_005edb12;
    }
    if (((byte)local_34 < 4) && (local_34._1_1_ < 4)) {
      if ((local_34._2_1_ < 4) || (local_34._3_1_ < 4)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                           ,0x63f,"(lanes[2] >= 4 && lanes[3] >= 4)",
                           "lanes[2] >= 4 && lanes[3] >= 4");
        if (!bVar4) goto LAB_005edf24;
        *puVar10 = 0;
      }
      lanes_00 = &local_34;
      pRVar14 = (RegOpnd *)srcs[0];
    }
    else {
      bVar13 = 2;
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      bVar15 = 0;
      for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
        if (bVar15 < 4 && local_64[lVar17] == '\x01') {
          lanesSrc[bVar15] = *(uint8 *)((long)&local_34 + lVar17);
          ordLanes[lVar17 + -4] = bVar15;
          bVar15 = bVar15 + 1;
        }
        else if (bVar13 < 4) {
          if (local_64[lVar17] != '\x02') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                               ,0x653,"(lanesSrc[i] == 2)","lanesSrc[i] == 2");
            if (!bVar4) goto LAB_005edf24;
            *puVar10 = 0;
          }
          lanesSrc[bVar13] = *(uint8 *)((long)&local_34 + lVar17);
          ordLanes[lVar17 + -4] = bVar13;
          bVar13 = bVar13 + 1;
        }
      }
      pRStack_a8 = IR::RegOpnd::New(this_01->m_type,this->m_func);
      instr_00 = (Instr *)srcs[5];
      InsertShufps(this,lanesSrc,&pRStack_a8->super_Opnd,(Opnd *)0x0,srcs[0],(Instr *)srcs[5]);
      lanes_00 = &fromSrc2;
      pRVar14 = pRStack_a8;
    }
  }
  InsertShufps(this,(uint8 *)lanes_00,this_01,&pRStack_a8->super_Opnd,&pRVar14->super_Opnd,instr_00)
  ;
LAB_005edb12:
  IR::Instr::Remove(instr_00);
  return pIVar2;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerShuffle_4(IR::Instr* instr)
{
    Js::OpCode irOpcode = instr->m_opcode;
    SList<IR::Opnd*> *args = Simd128GetExtendedArgs(instr);
    IR::Opnd *dst = args->Pop();
    IR::Opnd *srcs[6] = { nullptr, nullptr, nullptr, nullptr, nullptr, nullptr };

    int j = 0;
    while (!args->Empty() && j < 6)
    {
        srcs[j++] = args->Pop();
    }

    uint8 lanes[4], lanesSrc[4];
    uint fromSrc1, fromSrc2;
    IR::Instr *pInstr = instr->m_prev;

    Assert(dst->IsSimd128() && srcs[0] && srcs[0]->IsSimd128() && srcs[1] && srcs[1]->IsSimd128());
    Assert(irOpcode == Js::OpCode::Simd128_Shuffle_I4 || irOpcode == Js::OpCode::Simd128_Shuffle_U4 || irOpcode == Js::OpCode::Simd128_Shuffle_F4);

    // globOpt will type-spec if all lane indices are constants, and within range constraints to match a single SSE instruction
    AssertMsg(srcs[2] && srcs[2]->IsIntConstOpnd() &&
              srcs[3] && srcs[3]->IsIntConstOpnd() &&
              srcs[4] && srcs[4]->IsIntConstOpnd() &&
              srcs[5] && srcs[5]->IsIntConstOpnd(), "Type-specialized shuffle is supported only with constant lane indices");

    lanes[0] = (uint8) srcs[2]->AsIntConstOpnd()->AsInt32();
    lanes[1] = (uint8) srcs[3]->AsIntConstOpnd()->AsInt32();
    lanes[2] = (uint8) srcs[4]->AsIntConstOpnd()->AsInt32();
    lanes[3] = (uint8) srcs[5]->AsIntConstOpnd()->AsInt32();
    Assert(lanes[0] >= 0 && lanes[0] < 8);
    Assert(lanes[1] >= 0 && lanes[1] < 8);
    Assert(lanes[2] >= 0 && lanes[2] < 8);
    Assert(lanes[3] >= 0 && lanes[3] < 8);

    CheckShuffleLanes_4(lanes, lanesSrc, &fromSrc1, &fromSrc2);
    Assert(fromSrc1 + fromSrc2 == 4);

    if (fromSrc1 == 4 || fromSrc2 == 4)
    {
        // can be done with a swizzle
        IR::Opnd *srcOpnd = fromSrc1 == 4 ? srcs[0] : srcs[1];
        InsertShufps(lanes, dst, srcOpnd, srcOpnd, instr);
    }
    else if (fromSrc1 == 2)
    {
        if (lanes[0] < 4 && lanes[1] < 4)
        {
            // x86 friendly shuffle
            Assert(lanes[2] >= 4 && lanes[3] >= 4);
            InsertShufps(lanes, dst, srcs[0], srcs[1], instr);
        }
        else
        {
            // arbitrary shuffle with 2 lanes from each src
            uint8 ordLanes[4], reArrLanes[4];

            // order lanes based on which src they come from
            // compute re-arrangement mask
            for (uint8 i = 0, j1 = 0, j2 = 2; i < 4; i++)
            {
                if (lanesSrc[i] == 1 && j1 < 4)
                {
                    ordLanes[j1] = lanes[i];
                    reArrLanes[i] = j1;
                    j1++;
                }
                else if(j2 < 4)
                {
                    Assert(lanesSrc[i] == 2);
                    ordLanes[j2] = lanes[i];
                    reArrLanes[i] = j2;
                    j2++;
                }
            }
            IR::RegOpnd *temp = IR::RegOpnd::New(dst->GetType(), m_func);
            InsertShufps(ordLanes, temp, srcs[0], srcs[1], instr);
            InsertShufps(reArrLanes, dst, temp, temp, instr);
        }
    }
    else if (fromSrc1 == 3 || fromSrc2 == 3)
    {
        // shuffle with 3 lanes from one src, one from another

        IR::Instr *newInstr;
        IR::Opnd * majSrc, *minSrc;
        IR::RegOpnd *temp1 = IR::RegOpnd::New(dst->GetType(), m_func);
        IR::RegOpnd *temp2 = IR::RegOpnd::New(dst->GetType(), m_func);
        IR::RegOpnd *temp3 = IR::RegOpnd::New(dst->GetType(), m_func);
        uint8 minorityLane = 0, maxLaneValue;
        majSrc = fromSrc1 == 3 ? srcs[0] : srcs[1];
        minSrc = fromSrc1 == 3 ? srcs[1] : srcs[0];
        Assert(majSrc != minSrc);

        // Algorithm:
        // SHUFPS temp1, majSrc, lanes
        // SHUFPS temp2, minSrc, lanes
        // MOVUPS temp3, [minorityLane mask]
        // ANDPS  temp2, temp3          // mask all lanes but minorityLane
        // ANDNPS temp3, temp1          // zero minorityLane
        // ORPS   dst, temp2, temp3

        // find minorityLane to mask
        maxLaneValue = minSrc == srcs[0] ? 4 : 8;
        for (uint8 i = 0; i < 4; i++)
        {
            if (lanes[i] >= (maxLaneValue - 4) && lanes[i] < maxLaneValue)
            {
                minorityLane = i;
                break;
            }
        }
        IR::MemRefOpnd * laneMask = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86FourLanesMaskAddr(minorityLane), dst->GetType(), m_func);

        InsertShufps(lanes, temp1, majSrc, majSrc, instr);
        InsertShufps(lanes, temp2, minSrc, minSrc, instr);
        newInstr = IR::Instr::New(Js::OpCode::MOVUPS, temp3, laneMask, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
        newInstr = IR::Instr::New(Js::OpCode::ANDPS, temp2, temp2, temp3, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
        newInstr = IR::Instr::New(Js::OpCode::ANDNPS, temp3, temp3, temp1, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
        newInstr = IR::Instr::New(Js::OpCode::ORPS, dst, temp2, temp3, m_func);
        instr->InsertBefore(newInstr);
        Legalize(newInstr);
    }

    instr->Remove();
    return pInstr;
}